

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O3

void __thiscall YAJLMiscData::fetch_comment(YAJLMiscData *this,bitio_stream *bstream)

{
  pointer *pppcVar1;
  bool bVar2;
  iterator __position;
  ssize_t sVar3;
  char *pcVar4;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar5;
  void *extraout_RDX_02;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  char *com_data;
  char *local_38;
  
  bVar2 = this->ignore;
  sVar3 = bitio::bitio_stream::read(bstream,0x10,in_RDX,in_RCX);
  if (bVar2 == false) {
    uVar8 = (int)sVar3 - 2;
    uVar6 = (ulong)(uVar8 & 0xffff);
    pcVar4 = (char *)operator_new__(uVar6);
    local_38 = pcVar4;
    if ((short)uVar8 != 0) {
      uVar7 = 0;
      pvVar5 = extraout_RDX_01;
      do {
        sVar3 = bitio::bitio_stream::read(bstream,8,pvVar5,in_RCX);
        pcVar4[uVar7] = (char)sVar3;
        uVar7 = uVar7 + 1;
        pvVar5 = extraout_RDX_02;
      } while (uVar6 != uVar7);
    }
    __position._M_current =
         (this->comments).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->comments).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                ((vector<char*,std::allocator<char*>> *)&this->comments,__position,&local_38);
    }
    else {
      *__position._M_current = pcVar4;
      pppcVar1 = &(this->comments).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  else {
    pvVar5 = extraout_RDX;
    for (uVar8 = (int)sVar3 + 0xfffeU & 0xffff; uVar8 != 0; uVar8 = uVar8 - 1) {
      bitio::bitio_stream::read(bstream,8,pvVar5,in_RCX);
      pvVar5 = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void YAJLMiscData::fetch_comment(bitio::bitio_stream *bstream) {
    if (!ignore) {
        // param-length followed by comment-bytes.
        u16 length = bstream->read(0x10);
        length -= 2;
        auto *com_data = new char[length];
        for (int i = 0; i < length; i++) {
            com_data[i] = bstream->read(0x8);
        }
        comments.push_back(com_data);
    } else {
        u16 length = bstream->read(0x10);
        length -= 2;
        for (int i = 0; i < length; i++) {
            bstream->read(0x8);
        }
    }
}